

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.c
# Opt level: O1

int fft_segment_fwd(mixed_segment *segment)

{
  undefined4 *puVar1;
  uint n;
  uint uVar2;
  long lVar3;
  float *pSrc;
  long lVar4;
  double __x;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 *puVar9;
  double dVar10;
  double dVar11;
  uint32_t out_samples;
  uint32_t in_samples;
  float *out;
  float *in;
  uint local_98;
  uint32_t local_94;
  undefined8 *local_90;
  double local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  float *local_40;
  float *local_38;
  
  puVar9 = (undefined8 *)segment->data;
  n = *(uint *)((long)puVar9 + 0x14);
  uVar7 = (ulong)n;
  uVar2 = *(uint *)(puVar9 + 3);
  lVar3 = puVar9[5];
  pSrc = (float *)puVar9[6];
  lVar4 = puVar9[7];
  local_94 = 0xffffffff;
  mixed_buffer_request_read(&local_38,&local_94,(mixed_buffer *)*puVar9);
  uVar8 = uVar7 / uVar2;
  if (puVar9[4] == 0) {
    puVar9[4] = uVar7 - uVar8;
  }
  local_90 = puVar9;
  if (local_94 != 0) {
    local_68 = (double)uVar7;
    local_50 = (double)*(uint *)(puVar9 + 2) / local_68;
    local_48 = ((double)uVar8 * 6.283185307179586) / local_68;
    local_58 = (double)uVar2;
    uVar6 = 0;
    local_80 = uVar7 - uVar8;
    local_78 = uVar8;
    do {
      lVar5 = puVar9[4];
      *(float *)(lVar3 + lVar5 * 4) = local_38[uVar6];
      lVar5 = lVar5 + 1;
      puVar9[4] = lVar5;
      if ((long)uVar7 <= lVar5) {
        local_98 = n;
        local_70 = uVar6;
        mixed_buffer_clear((mixed_buffer *)puVar9[1]);
        mixed_buffer_request_write(&local_40,&local_98,(mixed_buffer *)puVar9[1]);
        puVar9[4] = local_80;
        if (n != 0) {
          uVar8 = 0;
          do {
            dVar10 = cos(((double)(long)uVar8 * 6.283185307179586) / local_68);
            pSrc[uVar8 * 2] = (float)((double)*(float *)(lVar3 + uVar8 * 4) * (dVar10 * -0.5 + 0.5))
            ;
            pSrc[uVar8 * 2 + 1] = 0.0;
            uVar8 = uVar8 + 1;
          } while (uVar7 != uVar8);
        }
        spiral_fft_float(n,-1,pSrc,pSrc);
        lVar5 = 0;
        do {
          local_88 = (double)pSrc[lVar5 * 2];
          dVar10 = (double)pSrc[lVar5 * 2 + 1];
          dVar11 = local_88 * local_88 + dVar10 * dVar10;
          if (dVar11 < 0.0) {
            local_60 = dVar10;
            dVar11 = sqrt(dVar11);
            dVar10 = local_60;
          }
          else {
            dVar11 = SQRT(dVar11);
          }
          __x = local_88;
          local_88 = dVar11 + dVar11;
          dVar10 = atan2(dVar10,__x);
          puVar9 = local_90;
          dVar11 = (dVar10 - (double)*(float *)(lVar4 + lVar5 * 4)) - (double)lVar5 * local_48;
          uVar6 = (ulong)(dVar11 / 3.141592653589793);
          uVar8 = uVar6 & 0xfffffffffffffffe;
          if (-1 < (long)uVar6) {
            uVar8 = ((uint)uVar6 & 1) + uVar6;
          }
          *(float *)(lVar4 + lVar5 * 4) = (float)dVar10;
          local_40[lVar5 * 2] =
               (float)((double)lVar5 * local_50 +
                      ((((double)(long)uVar8 * -3.141592653589793 + dVar11) * local_58) /
                      6.283185307179586) * local_50);
          local_40[lVar5 * 2 + 1] = (float)local_88;
          lVar5 = lVar5 + 1;
        } while ((ulong)(n >> 1) + 1 != lVar5);
        mixed_buffer_finish_write(local_98,(mixed_buffer *)local_90[1]);
        uVar6 = local_70;
        if (0 < local_80) {
          lVar5 = 0;
          do {
            puVar1 = (undefined4 *)(lVar3 + lVar5 * 4);
            *puVar1 = puVar1[local_78];
            lVar5 = lVar5 + 1;
          } while (lVar5 < local_80);
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_94);
  }
  mixed_buffer_finish_read(local_94,(mixed_buffer *)*local_90);
  return 1;
}

Assistant:

VECTORIZE int fft_segment_fwd(struct mixed_segment *segment){
  struct fft_segment_data *data = (struct fft_segment_data *)segment->data;
  uint32_t framesize = data->framesize;
  uint32_t oversampling = data->oversampling;
  float *restrict in_fifo = data->fifo;
  float *restrict fft_workspace = data->fft_workspace;
  float *restrict last_phase = data->phase;

  float *restrict in, *restrict out;
  uint32_t in_samples = UINT32_MAX;
  mixed_buffer_request_read(&in, &in_samples, data->in);

  double magnitude, phase, tmp, window, real, imag;
  long i, k, qpd;
  long framesize2 = framesize/2;
  long step = framesize/oversampling;
  double bin_frequencies = (double)data->samplerate/(double)framesize;
  double expected = 2.*M_PI*(double)step/(double)framesize;
  long fifo_latency = framesize-step;
  if (data->overlap == 0) data->overlap = fifo_latency;

  for(i=0; i<in_samples; i++){
    in_fifo[data->overlap] = in[i];
    data->overlap++;
    if(data->overlap >= framesize){
      uint32_t out_samples = framesize;
      mixed_buffer_clear(data->out);
      mixed_buffer_request_write(&out, &out_samples, data->out);
      
      data->overlap = fifo_latency;

      for(k=0; k<framesize; k++){
        window = -.5*cos(2.*M_PI*(double)k/(double)framesize)+.5;
        fft_workspace[2*k] = in_fifo[k] * window;
        fft_workspace[2*k+1] = 0.;
      }

      spiral_fft_float(framesize, -1, fft_workspace, fft_workspace);

      for(k=0; k<=framesize2; k++){
        real = fft_workspace[2*k];
        imag = fft_workspace[2*k+1];
        magnitude = 2.*sqrt(real*real + imag*imag);
        phase = atan2(imag,real);
        
        tmp = phase - last_phase[k];
        last_phase[k] = phase;
        tmp -= (double)k*expected;

        qpd = tmp/M_PI;
        if (qpd >= 0) qpd += qpd&1;
        else qpd -= qpd&1;
        tmp -= M_PI*(double)qpd;

        tmp = oversampling*tmp/(2.*M_PI);
        tmp = (double)k*bin_frequencies + tmp*bin_frequencies;

        out[k*2] = tmp;
        out[k*2+1] = magnitude;
      }
      mixed_buffer_finish_write(out_samples, data->out);
      
      for (k = 0; k < fifo_latency; k++) in_fifo[k] = in_fifo[k+step];
    }
  }
  
  mixed_buffer_finish_read(in_samples, data->in);
  return 1;
}